

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosMpiHandshake.cpp
# Opt level: O0

vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
* adios2::helper::HandshakeRank
            (string *filename,char mode,int timeoutSeconds,MPI_Comm localComm,int verbosity)

{
  bool bVar1;
  int *piVar2;
  void *this;
  reference piVar3;
  rep rVar4;
  char *pcVar5;
  istream *piVar6;
  reference pvVar7;
  size_type sVar8;
  ostream *poVar9;
  int in_ECX;
  char in_DL;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  int in_R9D;
  int *j;
  const_iterator __end4_1;
  const_iterator __begin4_1;
  vector<int,_std::allocator<int>_> *__range4_1;
  vector<int,_std::allocator<int>_> *i_5;
  iterator __end3_1;
  iterator __begin3_1;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *__range3_1;
  int s;
  stringstream output;
  int i_4;
  int i_3;
  int i_2;
  int dims [3];
  string line_3;
  ifstream fs_3;
  string line_2;
  ifstream fs_4;
  ofstream fsc_1;
  int i_1;
  iterator __end5;
  iterator __begin5;
  vector<int,_std::allocator<int>_> *__range5;
  string line_1;
  ifstream fs_1;
  string line;
  __enable_if_is_duration<std::chrono::duration<long>_> duration;
  time_point nowTime;
  ifstream fs_2;
  time_point startTime;
  ofstream fsc;
  int i;
  iterator __end4;
  iterator __begin4;
  vector<int,_std::allocator<int>_> *__range4;
  int rank;
  iterator __end3;
  iterator __begin3;
  vector<int,_std::allocator<int>_> *__range3;
  ofstream fs;
  vector<int,_std::allocator<int>_> allLocalRanks;
  int worldSize;
  int worldRank;
  int localSize;
  int localRank;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *ret;
  undefined4 uVar10;
  undefined4 in_stack_ffffffffffffeb0c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffeb18;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffeb20;
  size_type in_stack_ffffffffffffeb28;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffeb30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffeb38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffeb50;
  undefined4 in_stack_ffffffffffffeb58;
  undefined4 in_stack_ffffffffffffeb5c;
  string *in_stack_ffffffffffffeb60;
  string *in_stack_ffffffffffffeb68;
  undefined4 in_stack_ffffffffffffeb70;
  undefined4 in_stack_ffffffffffffeb74;
  string local_13d0 [32];
  reference local_13b0;
  int *local_13a8;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_13a0;
  reference local_1398;
  reference local_1390;
  vector<int,_std::allocator<int>_> *local_1388;
  __normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
  local_1380 [2];
  int local_136c;
  stringstream local_1368 [16];
  ostream local_1358 [376];
  int local_11e0;
  int local_11dc;
  int *local_11d8;
  int *local_11d0;
  int local_11c8;
  undefined4 local_11c4 [3];
  string local_11b8 [32];
  int local_1198;
  int local_1194;
  string local_1190 [32];
  string local_1170 [32];
  istream local_1150 [520];
  string local_f48 [32];
  string local_f28 [32];
  string local_f08 [32];
  istream local_ee8 [520];
  string local_ce0 [32];
  ostream local_cc0 [516];
  int local_abc;
  int *local_ab8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_ab0;
  undefined1 *local_aa8;
  string local_aa0 [32];
  int local_a80;
  int local_a7c;
  string local_a78 [32];
  string local_a58 [32];
  istream local_a38 [520];
  string local_830 [36];
  int local_80c;
  string local_808 [32];
  string local_7e8 [32];
  string local_7c8 [39];
  allocator local_7a1;
  string local_7a0 [39];
  allocator local_779;
  string local_778 [39];
  allocator local_751;
  string local_750 [32];
  rep local_730;
  duration<long,_std::ratio<1L,_1L>_> local_728;
  undefined8 local_720;
  istream local_718 [520];
  undefined8 local_510;
  string local_508 [32];
  ostream local_4e8 [516];
  int local_2e4;
  int *local_2e0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_2d8;
  undefined1 *local_2d0;
  int local_2c4;
  int *local_2c0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_2b8;
  undefined1 *local_2b0;
  string local_2a8 [32];
  string local_288 [32];
  undefined1 local_268 [520];
  undefined1 local_60 [28];
  undefined1 local_44 [4];
  int local_40;
  undefined1 local_3c [4];
  int local_38 [4];
  byte local_25;
  int local_24;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  int local_18;
  char local_11;
  
  local_25 = 0;
  local_24 = in_R9D;
  local_20 = in_R8;
  local_18 = in_ECX;
  local_11 = in_DL;
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)0x1a7777);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb28,
           (allocator_type *)in_stack_ffffffffffffeb20._M_current);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)0x1a77a0);
  MPI_Comm_rank(local_20,local_38);
  MPI_Comm_size(local_20,local_3c);
  MPI_Comm_rank(&ompi_mpi_comm_world,&local_40);
  MPI_Comm_size(&ompi_mpi_comm_world,local_44);
  std::allocator<int>::allocator((allocator<int> *)0x1a781f);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb28,
             (allocator_type *)in_stack_ffffffffffffeb20._M_current);
  std::allocator<int>::~allocator((allocator<int> *)0x1a784b);
  piVar2 = std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)0x1a7858);
  uVar10 = 0;
  __lhs = local_20;
  MPI_Gather(&local_40,1,&ompi_mpi_int,piVar2);
  if (local_38[0] == 0) {
    std::ofstream::ofstream(local_268);
    std::operator+(in_stack_ffffffffffffeb38,(char *)in_stack_ffffffffffffeb30);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffeb18._M_current,(char)((ulong)__lhs >> 0x38));
    std::ofstream::open(local_268,local_288,0x10);
    std::__cxx11::string::~string(local_288);
    std::__cxx11::string::~string(local_2a8);
    local_2b0 = local_60;
    local_2b8._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)
                           CONCAT44(in_stack_ffffffffffffeb0c,uVar10));
    local_2c0 = (int *)std::vector<int,_std::allocator<int>_>::end
                                 ((vector<int,_std::allocator<int>_> *)
                                  CONCAT44(in_stack_ffffffffffffeb0c,uVar10));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              __lhs,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                     *)CONCAT44(in_stack_ffffffffffffeb0c,uVar10)), bVar1) {
      piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_2b8);
      local_2c4 = *piVar3;
      this = (void *)std::ostream::operator<<(local_268,local_2c4);
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_2b8);
    }
    std::ofstream::close();
    if (local_11 == 'r') {
      local_2d0 = local_60;
      local_2d8._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::begin
                            ((vector<int,_std::allocator<int>_> *)
                             CONCAT44(in_stack_ffffffffffffeb0c,uVar10));
      local_2e0 = (int *)std::vector<int,_std::allocator<int>_>::end
                                   ((vector<int,_std::allocator<int>_> *)
                                    CONCAT44(in_stack_ffffffffffffeb0c,uVar10));
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *
                                )__lhs,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                        *)CONCAT44(in_stack_ffffffffffffeb0c,uVar10)), bVar1) {
        piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&local_2d8);
        local_2e4 = *piVar3;
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::operator[](in_RDI,0);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffeb20._M_current,
                   in_stack_ffffffffffffeb18._M_current);
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::operator[](in_RDI,2);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffeb20._M_current,
                   in_stack_ffffffffffffeb18._M_current);
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&local_2d8);
      }
      std::ofstream::ofstream(local_4e8);
      std::operator+(in_stack_ffffffffffffeb38,(char *)in_stack_ffffffffffffeb30);
      std::ofstream::open(local_4e8,local_508,0x10);
      std::__cxx11::string::~string(local_508);
      std::operator<<(local_4e8,"completed");
      std::ofstream::close();
      local_510 = std::chrono::_V2::system_clock::now();
      do {
        std::ifstream::ifstream(local_718);
        local_720 = std::chrono::_V2::system_clock::now();
        local_730 = (rep)std::chrono::operator-
                                   ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                     *)in_stack_ffffffffffffeb18._M_current,
                                    (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                     *)__lhs);
        local_728.__r =
             (rep)std::chrono::
                  duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                            ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                             CONCAT44(in_stack_ffffffffffffeb0c,uVar10));
        rVar4 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_728);
        if (local_18 < rVar4) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_750,"Helper",&local_751);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_778,"adiosMpiHandshake",&local_779);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_7a0,"HandshakeRank",&local_7a1);
          std::operator+((char *)CONCAT44(in_stack_ffffffffffffeb5c,in_stack_ffffffffffffeb58),
                         in_stack_ffffffffffffeb50);
          Throw<std::runtime_error>
                    ((string *)CONCAT44(in_stack_ffffffffffffeb74,in_stack_ffffffffffffeb70),
                     in_stack_ffffffffffffeb68,in_stack_ffffffffffffeb60,
                     (string *)CONCAT44(in_stack_ffffffffffffeb5c,in_stack_ffffffffffffeb58),
                     (int)((ulong)in_stack_ffffffffffffeb50 >> 0x20));
          std::__cxx11::string::~string(local_7c8);
          std::__cxx11::string::~string(local_7a0);
          std::allocator<char>::~allocator((allocator<char> *)&local_7a1);
          std::__cxx11::string::~string(local_778);
          std::allocator<char>::~allocator((allocator<char> *)&local_779);
          std::__cxx11::string::~string(local_750);
          std::allocator<char>::~allocator((allocator<char> *)&local_751);
        }
        std::operator+(in_stack_ffffffffffffeb38,(char *)in_stack_ffffffffffffeb30);
        std::ifstream::open(local_718,local_7e8,8);
        std::__cxx11::string::~string(local_7e8);
        std::__cxx11::string::string(local_808);
        std::getline<char,std::char_traits<char>,std::allocator<char>>(local_718,local_808);
        bVar1 = std::operator!=(__lhs,(char *)CONCAT44(in_stack_ffffffffffffeb0c,uVar10));
        if (bVar1) {
          local_80c = 6;
        }
        else {
          std::ifstream::close();
          std::operator+(in_stack_ffffffffffffeb38,(char *)in_stack_ffffffffffffeb30);
          pcVar5 = (char *)std::__cxx11::string::c_str();
          remove(pcVar5);
          std::__cxx11::string::~string(local_830);
          local_80c = 7;
        }
        std::__cxx11::string::~string(local_808);
        std::ifstream::~ifstream(local_718);
      } while ((local_80c == 0) || (local_80c == 6));
      std::ifstream::ifstream(local_a38);
      std::operator+(in_stack_ffffffffffffeb38,(char *)in_stack_ffffffffffffeb30);
      std::ifstream::open(local_a38,local_a58,8);
      std::__cxx11::string::~string(local_a58);
      std::__cxx11::string::string(local_a78);
      while( true ) {
        piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_a38,local_a78)
        ;
        bVar1 = std::ios::operator_cast_to_bool
                          ((ios *)(piVar6 + *(long *)(*(long *)piVar6 + -0x18)));
        if (!bVar1) break;
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::operator[](in_RDI,0);
        local_a7c = std::__cxx11::stoi(__lhs,(size_t *)CONCAT44(in_stack_ffffffffffffeb0c,uVar10),0)
        ;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)__lhs,
                   (value_type_conflict *)CONCAT44(in_stack_ffffffffffffeb0c,uVar10));
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::operator[](in_RDI,1);
        local_a80 = std::__cxx11::stoi(__lhs,(size_t *)CONCAT44(in_stack_ffffffffffffeb0c,uVar10),0)
        ;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)__lhs,
                   (value_type_conflict *)CONCAT44(in_stack_ffffffffffffeb0c,uVar10));
      }
      local_80c = 8;
      std::__cxx11::string::~string(local_a78);
      std::ifstream::close();
      std::operator+(in_stack_ffffffffffffeb38,(char *)in_stack_ffffffffffffeb30);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      remove(pcVar5);
      std::__cxx11::string::~string(local_aa0);
      std::ifstream::~ifstream(local_a38);
      std::ofstream::~ofstream(local_4e8);
    }
    else if (local_11 == 'w') {
      local_aa8 = local_60;
      local_ab0._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::begin
                            ((vector<int,_std::allocator<int>_> *)
                             CONCAT44(in_stack_ffffffffffffeb0c,uVar10));
      local_ab8 = (int *)std::vector<int,_std::allocator<int>_>::end
                                   ((vector<int,_std::allocator<int>_> *)
                                    CONCAT44(in_stack_ffffffffffffeb0c,uVar10));
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *
                                )__lhs,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                        *)CONCAT44(in_stack_ffffffffffffeb0c,uVar10)), bVar1) {
        piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&local_ab0);
        local_abc = *piVar3;
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::operator[](in_RDI,0);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffeb20._M_current,
                   in_stack_ffffffffffffeb18._M_current);
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::operator[](in_RDI,1);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffeb20._M_current,
                   in_stack_ffffffffffffeb18._M_current);
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&local_ab0);
      }
      std::ofstream::ofstream(local_cc0);
      std::operator+(in_stack_ffffffffffffeb38,(char *)in_stack_ffffffffffffeb30);
      std::ofstream::open(local_cc0,local_ce0,0x10);
      std::__cxx11::string::~string(local_ce0);
      std::operator<<(local_cc0,"completed");
      std::ofstream::close();
      do {
        std::ifstream::ifstream(local_ee8);
        std::operator+(in_stack_ffffffffffffeb38,(char *)in_stack_ffffffffffffeb30);
        std::ifstream::open(local_ee8,local_f08,8);
        std::__cxx11::string::~string(local_f08);
        std::__cxx11::string::string(local_f28);
        std::getline<char,std::char_traits<char>,std::allocator<char>>(local_ee8,local_f28);
        bVar1 = std::operator!=(__lhs,(char *)CONCAT44(in_stack_ffffffffffffeb0c,uVar10));
        if (bVar1) {
          local_80c = 0xc;
        }
        else {
          std::ifstream::close();
          std::operator+(in_stack_ffffffffffffeb38,(char *)in_stack_ffffffffffffeb30);
          pcVar5 = (char *)std::__cxx11::string::c_str();
          remove(pcVar5);
          std::__cxx11::string::~string(local_f48);
          local_80c = 0xd;
        }
        std::__cxx11::string::~string(local_f28);
        std::ifstream::~ifstream(local_ee8);
      } while ((local_80c == 0) || (local_80c == 0xc));
      std::ifstream::ifstream(local_1150);
      std::operator+(in_stack_ffffffffffffeb38,(char *)in_stack_ffffffffffffeb30);
      std::ifstream::open(local_1150,local_1170,8);
      std::__cxx11::string::~string(local_1170);
      std::__cxx11::string::string(local_1190);
      while( true ) {
        piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           (local_1150,local_1190);
        bVar1 = std::ios::operator_cast_to_bool
                          ((ios *)(piVar6 + *(long *)(*(long *)piVar6 + -0x18)));
        if (!bVar1) break;
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::operator[](in_RDI,0);
        local_1194 = std::__cxx11::stoi(__lhs,(size_t *)CONCAT44(in_stack_ffffffffffffeb0c,uVar10),0
                                       );
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)__lhs,
                   (value_type_conflict *)CONCAT44(in_stack_ffffffffffffeb0c,uVar10));
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::operator[](in_RDI,2);
        local_1198 = std::__cxx11::stoi(__lhs,(size_t *)CONCAT44(in_stack_ffffffffffffeb0c,uVar10),0
                                       );
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)__lhs,
                   (value_type_conflict *)CONCAT44(in_stack_ffffffffffffeb0c,uVar10));
      }
      local_80c = 0xe;
      std::__cxx11::string::~string(local_1190);
      std::ifstream::close();
      std::operator+(in_stack_ffffffffffffeb38,(char *)in_stack_ffffffffffffeb30);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      remove(pcVar5);
      std::__cxx11::string::~string(local_11b8);
      std::ifstream::~ifstream(local_1150);
      std::ofstream::~ofstream(local_cc0);
    }
    std::ofstream::~ofstream(local_268);
  }
  if (local_38[0] == 0) {
    for (local_11c8 = 0; local_11c8 < 3; local_11c8 = local_11c8 + 1) {
      pvVar7 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](in_RDI,(long)local_11c8);
      sVar8 = std::vector<int,_std::allocator<int>_>::size(pvVar7);
      local_11c4[local_11c8] = (int)sVar8;
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::operator[](in_RDI,(long)local_11c8);
      local_11d0 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                    ((vector<int,_std::allocator<int>_> *)
                                     CONCAT44(in_stack_ffffffffffffeb0c,uVar10));
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::operator[](in_RDI,(long)local_11c8);
      local_11d8 = (int *)std::vector<int,_std::allocator<int>_>::end
                                    ((vector<int,_std::allocator<int>_> *)
                                     CONCAT44(in_stack_ffffffffffffeb0c,uVar10));
      std::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                (in_stack_ffffffffffffeb20,in_stack_ffffffffffffeb18);
    }
  }
  MPI_Bcast(local_11c4,3,&ompi_mpi_int,0,local_20);
  if (local_38[0] != 0) {
    for (local_11dc = 0; local_11dc < 3; local_11dc = local_11dc + 1) {
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::operator[](in_RDI,(long)local_11dc);
      std::vector<int,_std::allocator<int>_>::resize
                (in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb28);
    }
  }
  for (local_11e0 = 0; local_11e0 < 3; local_11e0 = local_11e0 + 1) {
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::operator[](in_RDI,(long)local_11e0);
    piVar2 = std::vector<int,_std::allocator<int>_>::data
                       ((vector<int,_std::allocator<int>_> *)0x1a8b34);
    pvVar7 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[](in_RDI,(long)local_11e0);
    sVar8 = std::vector<int,_std::allocator<int>_>::size(pvVar7);
    MPI_Bcast(piVar2,sVar8 & 0xffffffff,&ompi_mpi_int,0,local_20);
  }
  if (4 < local_24) {
    std::__cxx11::stringstream::stringstream(local_1368);
    poVar9 = std::operator<<(local_1358,"World Rank ");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_40);
    poVar9 = std::operator<<(poVar9,": ");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    local_136c = 0;
    local_1380[0]._M_current =
         (vector<int,_std::allocator<int>_> *)
         std::
         vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ::begin((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  *)CONCAT44(in_stack_ffffffffffffeb0c,uVar10));
    local_1388 = (vector<int,_std::allocator<int>_> *)
                 std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::end((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        *)CONCAT44(in_stack_ffffffffffffeb0c,uVar10));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                               *)__lhs,(__normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                        *)CONCAT44(in_stack_ffffffffffffeb0c,uVar10)), bVar1) {
      local_1390 = __gnu_cxx::
                   __normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                   ::operator*(local_1380);
      poVar9 = std::operator<<(local_1358,"    ");
      in_stack_ffffffffffffeb20._M_current = (int *)std::ostream::operator<<(poVar9,local_136c);
      std::operator<<((ostream *)in_stack_ffffffffffffeb20._M_current,": ");
      local_1398 = local_1390;
      local_13a0._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::begin
                            ((vector<int,_std::allocator<int>_> *)
                             CONCAT44(in_stack_ffffffffffffeb0c,uVar10));
      local_13a8 = (int *)std::vector<int,_std::allocator<int>_>::end
                                    ((vector<int,_std::allocator<int>_> *)
                                     CONCAT44(in_stack_ffffffffffffeb0c,uVar10));
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                 *)__lhs,(__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                          *)CONCAT44(in_stack_ffffffffffffeb0c,uVar10)), bVar1) {
        local_13b0 = __gnu_cxx::
                     __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator*(&local_13a0);
        poVar9 = (ostream *)std::ostream::operator<<(local_1358,*local_13b0);
        std::operator<<(poVar9,", ");
        __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
        operator++(&local_13a0);
      }
      std::ostream::operator<<(local_1358,std::endl<char,std::char_traits<char>>);
      local_136c = local_136c + 1;
      __gnu_cxx::
      __normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
      ::operator++(local_1380);
    }
    std::__cxx11::stringstream::str();
    std::operator<<((ostream *)&std::cout,local_13d0);
    std::__cxx11::string::~string(local_13d0);
    std::__cxx11::stringstream::~stringstream(local_1368);
  }
  local_25 = 1;
  local_80c = 1;
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffeb20._M_current);
  if ((local_25 & 1) == 0) {
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)in_stack_ffffffffffffeb20._M_current);
  }
  return in_RDI;
}

Assistant:

const std::vector<std::vector<int>> HandshakeRank(const std::string &filename, const char mode,
                                                  const int timeoutSeconds, MPI_Comm localComm,
                                                  int verbosity)
{
    std::vector<std::vector<int>> ret(3);

    int localRank;
    int localSize;
    int worldRank;
    int worldSize;

    MPI_Comm_rank(localComm, &localRank);
    MPI_Comm_size(localComm, &localSize);

    MPI_Comm_rank(MPI_COMM_WORLD, &worldRank);
    MPI_Comm_size(MPI_COMM_WORLD, &worldSize);

    std::vector<int> allLocalRanks(localSize);

    MPI_Gather(&worldRank, 1, MPI_INT, allLocalRanks.data(), 1, MPI_INT, 0, localComm);

    if (localRank == 0)
    {
        std::ofstream fs;
        fs.open(filename + "." + mode);
        for (auto rank : allLocalRanks)
        {
            fs << rank << std::endl;
        }
        fs.close();

        if (mode == 'r')
        {

            for (auto i : allLocalRanks)
            {
                ret[0].push_back(i);
                ret[2].push_back(i);
            }

            std::ofstream fsc;
            fsc.open(filename + ".r.c");
            fsc << "completed";
            fsc.close();

            auto startTime = std::chrono::system_clock::now();
            while (true)
            {
                std::ifstream fs;
                try
                {
                    auto nowTime = std::chrono::system_clock::now();
                    auto duration =
                        std::chrono::duration_cast<std::chrono::seconds>(nowTime - startTime);
                    if (duration.count() > timeoutSeconds)
                    {
                        helper::Throw<std::runtime_error>(
                            "Helper", "adiosMpiHandshake", "HandshakeRank",
                            "Mpi handshake timeout for Stream " + filename);
                    }

                    fs.open(filename + ".w.c");
                    std::string line;
                    std::getline(fs, line);
                    if (line != "completed")
                    {
                        continue;
                    }
                    fs.close();
                    remove((filename + ".w.c\0").c_str());
                    break;
                }
                catch (...)
                {
                    continue;
                }
            }

            std::ifstream fs;
            fs.open(filename + ".w");
            for (std::string line; std::getline(fs, line);)
            {
                ret[0].push_back(std::stoi(line));
                ret[1].push_back(std::stoi(line));
            }
            fs.close();
            remove((filename + ".w\0").c_str());
        }
        else if (mode == 'w')
        {
            for (auto i : allLocalRanks)
            {
                ret[0].push_back(i);
                ret[1].push_back(i);
            }

            std::ofstream fsc;
            fsc.open(filename + ".w.c");
            fsc << "completed";
            fsc.close();

            while (true)
            {
                std::ifstream fs;
                try
                {
                    fs.open(filename + ".r.c");
                    std::string line;
                    std::getline(fs, line);
                    if (line != "completed")
                    {
                        continue;
                    }
                    fs.close();
                    remove((filename + ".r.c\0").c_str());
                    break;
                }
                catch (...)
                {
                    continue;
                }
            }

            std::ifstream fs;
            fs.open(filename + ".r");
            for (std::string line; std::getline(fs, line);)
            {
                ret[0].push_back(std::stoi(line));
                ret[2].push_back(std::stoi(line));
            }
            fs.close();
            remove((filename + ".r\0").c_str());
        }
    }

    int dims[3];

    if (localRank == 0)
    {
        for (int i = 0; i < 3; ++i)
        {
            dims[i] = static_cast<int>(ret[i].size());
            std::sort(ret[i].begin(), ret[i].end());
        }
    }

    MPI_Bcast(dims, 3, MPI_INT, 0, localComm);

    if (localRank != 0)
    {
        for (int i = 0; i < 3; ++i)
        {
            ret[i].resize(dims[i]);
        }
    }

    for (int i = 0; i < 3; ++i)
    {
        MPI_Bcast(ret[i].data(), static_cast<int>(ret[i].size()), MPI_INT, 0, localComm);
    }

    if (verbosity >= 5)
    {
        std::stringstream output;
        output << "World Rank " << worldRank << ": " << std::endl;
        int s = 0;
        for (const auto &i : ret)
        {
            output << "    " << s << ": ";
            for (const auto &j : i)
            {
                output << j << ", ";
            }
            output << std::endl;
            ++s;
        }
        std::cout << output.str();
    }

    return ret;
}